

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PackedArray_my.h
# Opt level: O0

void __thiscall
PackedArray_my<17U,_2048U>::set_or(PackedArray_my<17U,_2048U> *this,uint offset,uint32_t x)

{
  uint uVar1;
  uint uVar2;
  uint uVar3;
  sbyte sVar4;
  uint64_t *p;
  uint start_bit;
  uint cell;
  uint32_t x_local;
  uint offset_local;
  PackedArray_my<17U,_2048U> *this_local;
  
  uVar1 = this->mask & x;
  uVar2 = offset * 0x11 >> 5;
  uVar3 = offset * 0x11 & 0x1f;
  sVar4 = (sbyte)uVar3;
  if (uVar3 < 0x10) {
    this->buf[uVar2] = uVar1 << sVar4 | this->buf[uVar2];
  }
  else {
    *(ulong *)(this->buf + uVar2) = (ulong)uVar1 << sVar4 | *(ulong *)(this->buf + uVar2);
  }
  return;
}

Assistant:

void set_or(unsigned offset, uint32_t x) {
        x &= mask;

        unsigned cell = offset*bits / 32;
        unsigned start_bit = (offset*bits) % 32;
        if(start_bit <= (32 - bits) ) {
            buf[cell] |= x << start_bit;
        } else {
            uint64_t &p = (uint64_t&)buf[cell];
            p |= uint64_t(x) << start_bit;
        }
    }